

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *pNtk,Abc_Obj_t *pChain,int fUseInv,int fVerbose)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Abc_Obj_t *local_58;
  float Arrival2;
  float Arrival1;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNodeMin;
  Abc_Obj_t *pListInv;
  Abc_Obj_t *pListDir;
  int fVerbose_local;
  int fUseInv_local;
  Abc_Obj_t *pChain_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pChain == (Abc_Obj_t *)0x0) {
    __assert_fail("pChain",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x13b,"void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
  }
  if (pChain->pNext == (Abc_Obj_t *)0x0) {
    __assert_fail("pChain->pNext",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x13c,"void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
  }
  pNodeMin = (Abc_Obj_t *)0x0;
  pListInv = (Abc_Obj_t *)0x0;
  _Arrival2 = pChain->pNext;
  pNext = pChain;
  while (pNext != (Abc_Obj_t *)0x0) {
    if ((*(uint *)&pNext->field_0x14 >> 7 & 1) == 1) {
      pNext->pNext = pListInv;
      pListInv = pNext;
    }
    else {
      pNext->pNext = pNodeMin;
      pNodeMin = pNext;
    }
    pNext = _Arrival2;
    if (_Arrival2 == (Abc_Obj_t *)0x0) {
      local_58 = (Abc_Obj_t *)0x0;
    }
    else {
      local_58 = _Arrival2->pNext;
    }
    _Arrival2 = local_58;
  }
  pNode = pListInv;
  for (pNext = pListInv; pNext != (Abc_Obj_t *)0x0; pNext = pNext->pNext) {
    fVar3 = Abc_NodeReadArrivalWorst(pNode);
    fVar4 = Abc_NodeReadArrivalWorst(pNext);
    if ((fVar4 < fVar3) ||
       (((fVar3 == fVar4 && (!NAN(fVar3) && !NAN(fVar4))) &&
        (*(uint *)&pNext->field_0x14 >> 0xc < *(uint *)&pNode->field_0x14 >> 0xc)))) {
LAB_00387b0c:
      pNode = pNext;
    }
    else if (((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) &&
            (*(uint *)&pNode->field_0x14 >> 0xc == *(uint *)&pNext->field_0x14 >> 0xc)) {
      iVar1 = Abc_NodeDroppingCost(pNode);
      iVar2 = Abc_NodeDroppingCost(pNext);
      if (iVar1 < iVar2) goto LAB_00387b0c;
    }
  }
  for (pNext = pListInv; pNext != (Abc_Obj_t *)0x0; pNext = pNext->pNext) {
    if (pNext != pNode) {
      Abc_ObjTransferFanout(pNext,pNode);
    }
  }
  pNode = pNodeMin;
  pNext = pNodeMin;
  do {
    if (pNext == (Abc_Obj_t *)0x0) {
      for (pNext = pNodeMin; pNext != (Abc_Obj_t *)0x0; pNext = pNext->pNext) {
        if (pNext != pNode) {
          Abc_ObjTransferFanout(pNext,pNode);
        }
      }
      return;
    }
    fVar3 = Abc_NodeReadArrivalWorst(pNode);
    fVar4 = Abc_NodeReadArrivalWorst(pNext);
    if ((fVar4 < fVar3) ||
       (((fVar3 == fVar4 && (!NAN(fVar3) && !NAN(fVar4))) &&
        (*(uint *)&pNext->field_0x14 >> 0xc < *(uint *)&pNode->field_0x14 >> 0xc)))) {
LAB_00387c07:
      pNode = pNext;
    }
    else if (((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) &&
            (*(uint *)&pNode->field_0x14 >> 0xc == *(uint *)&pNext->field_0x14 >> 0xc)) {
      iVar1 = Abc_NodeDroppingCost(pNode);
      iVar2 = Abc_NodeDroppingCost(pNext);
      if (iVar1 < iVar2) goto LAB_00387c07;
    }
    pNext = pNext->pNext;
  } while( true );
}

Assistant:

void Abc_NtkFraigMergeClassMapped( Abc_Ntk_t * pNtk, Abc_Obj_t * pChain, int fUseInv, int fVerbose )
{
    Abc_Obj_t * pListDir, * pListInv;
    Abc_Obj_t * pNodeMin, * pNode, * pNext;
    float Arrival1, Arrival2;

    assert( pChain );
    assert( pChain->pNext );

    // divide the nodes into two parts: 
    // those that need the invertor and those that don't need
    pListDir = pListInv = NULL;
    for ( pNode = pChain, pNext = pChain->pNext; 
          pNode; 
          pNode = pNext, pNext = pNode? pNode->pNext : NULL )
    {
        // check to which class the node belongs
        if ( pNode->fPhase == 1 )
        {
            pNode->pNext = pListDir;
            pListDir = pNode;
        }
        else
        {
            pNode->pNext = pListInv;
            pListInv = pNode;
        }
    }

    // find the node with the smallest number of logic levels
    pNodeMin = pListDir;
    for ( pNode = pListDir; pNode; pNode = pNode->pNext )
    {
        Arrival1 = Abc_NodeReadArrivalWorst(pNodeMin);
        Arrival2 = Abc_NodeReadArrivalWorst(pNode   );
//        assert( Abc_ObjIsCi(pNodeMin) || Arrival1 > 0 );
//        assert( Abc_ObjIsCi(pNode)    || Arrival2 > 0 );
        if (  Arrival1 > Arrival2 ||
              (Arrival1 == Arrival2 && pNodeMin->Level >  pNode->Level) ||
              (Arrival1 == Arrival2 && pNodeMin->Level == pNode->Level &&
              Abc_NodeDroppingCost(pNodeMin) < Abc_NodeDroppingCost(pNode))  )
            pNodeMin = pNode;
    }

    // move the fanouts of the direct nodes
    for ( pNode = pListDir; pNode; pNode = pNode->pNext )
        if ( pNode != pNodeMin )
            Abc_ObjTransferFanout( pNode, pNodeMin );

    // find the node with the smallest number of logic levels
    pNodeMin = pListInv;
    for ( pNode = pListInv; pNode; pNode = pNode->pNext )
    {
        Arrival1 = Abc_NodeReadArrivalWorst(pNodeMin);
        Arrival2 = Abc_NodeReadArrivalWorst(pNode   );
//        assert( Abc_ObjIsCi(pNodeMin) || Arrival1 > 0 );
//        assert( Abc_ObjIsCi(pNode)    || Arrival2 > 0 );
        if (  Arrival1 > Arrival2 ||
              (Arrival1 == Arrival2 && pNodeMin->Level >  pNode->Level) ||
              (Arrival1 == Arrival2 && pNodeMin->Level == pNode->Level &&
              Abc_NodeDroppingCost(pNodeMin) < Abc_NodeDroppingCost(pNode))  )
            pNodeMin = pNode;
    }

    // move the fanouts of the direct nodes
    for ( pNode = pListInv; pNode; pNode = pNode->pNext )
        if ( pNode != pNodeMin )
            Abc_ObjTransferFanout( pNode, pNodeMin );
}